

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O2

void __thiscall helics::DependencyInfo::DependencyInfo(DependencyInfo *this)

{
  TimeData::TimeData(&this->super_TimeData);
  (this->fedID).gid = -2010000000;
  this->cyclic = false;
  this->connection = INDEPENDENT;
  this->dependent = false;
  this->dependency = false;
  this->forwarding = false;
  this->nonGranting = false;
  this->triggered = false;
  this->updateRequested = false;
  return;
}

Assistant:

DependencyInfo() = default;